

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cmd.c
# Opt level: O0

int cfg_cmd_handle_get(cfg_instance *instance,cfg_db *db,char *arg,autobuf *log)

{
  int iVar1;
  char *arg_00;
  cfg_entry *pcVar2;
  size_t sVar3;
  cfg_named_section *pcVar4;
  bool bVar5;
  avl_node *local_1b0;
  list_entity *__tempptr_12;
  list_entity *__tempptr_11;
  list_entity *__tempptr_10;
  list_entity *__tempptr_9;
  list_entity *__tempptr_8;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  char *pcStack_c8;
  int result;
  char *tmp;
  char *arg_copy;
  _parsed_argument pa;
  cfg_entry *entry_it;
  cfg_entry *entry;
  cfg_named_section *named_it;
  cfg_named_section *named;
  cfg_section_type *type_it;
  cfg_section_type *type;
  autobuf *log_local;
  char *arg_local;
  cfg_db *db_local;
  cfg_instance *instance_local;
  
  if ((arg == (char *)0x0) || (*arg == '\0')) {
    cfg_append_printable_line(log,"Section types in database:");
    type_it = (cfg_section_type *)(db->sectiontypes).list_head.next;
    named = (cfg_named_section *)(type_it->node).list.next;
    while ((type_it->node).list.prev != (db->sectiontypes).list_head.prev) {
      cfg_append_printable_line(log,"%s",type_it->type);
      type_it = (cfg_section_type *)named;
      named = (cfg_named_section *)(named->node).list.next;
    }
    return 0;
  }
  arg_00 = strdup(arg);
  if (arg_00 == (char *)0x0) {
    return -1;
  }
  __tempptr._4_4_ = -1;
  iVar1 = _do_parse_arg(arg_00,(_parsed_argument *)&arg_copy,log);
  if (iVar1 == 0) {
    if (pa.entry_key == (char *)0x0) {
      if (pa.section_name == (char *)0x0) {
        if (pa.section_type == (char *)0x0) {
          local_1b0 = avl_find(&db->sectiontypes,arg_copy);
          if (local_1b0 == (avl_node *)0x0) {
            local_1b0 = (avl_node *)0x0;
          }
          if ((local_1b0 == (avl_node *)0x0) || (*(int *)&local_1b0[1].key == 0)) {
            cfg_append_printable_line(log,"Cannot find data for section type: %s",arg);
            goto LAB_00173740;
          }
          if (local_1b0[1].parent[1].list.next != (list_entity *)0x0) {
            cfg_append_printable_line(log,"Named sections in section type: %s",arg_copy);
            named_it = (cfg_named_section *)local_1b0[1].parent;
            entry = (cfg_entry *)(named_it->node).list.next;
            while ((avl_node *)(named_it->node).list.prev != local_1b0[1].left) {
              cfg_append_printable_line(log,"%s",named_it->name);
              named_it = (cfg_named_section *)entry;
              entry = (cfg_entry *)(entry->node).list.next;
            }
            __tempptr._4_4_ = 0;
            goto LAB_00173740;
          }
        }
        pcVar4 = cfg_db_find_namedsection(db,arg_copy,pa.section_type);
        if (pcVar4 == (cfg_named_section *)0x0) {
          cfg_append_printable_line(log,"Cannot find data for section: %s",arg);
        }
        else {
          cfg_append_printable_line(log,"Entry keys for section \'%s\':",arg);
          entry_it = (cfg_entry *)(pcVar4->entries).list_head.next;
          pa.entry_value = (char *)(entry_it->node).list.next;
          while ((entry_it->node).list.prev != (pcVar4->entries).list_head.prev) {
            cfg_append_printable_line(log,"%s",entry_it->name);
            entry_it = (cfg_entry *)pa.entry_value;
            pa.entry_value = *(char **)pa.entry_value;
          }
          __tempptr._4_4_ = 0;
        }
      }
      else {
        pcVar2 = cfg_db_find_entry(db,arg_copy,pa.section_type,pa.section_name);
        if (pcVar2 == (cfg_entry *)0x0) {
          cfg_append_printable_line(log,"Cannot find data for entry: \'%s\'\n",arg);
        }
        else {
          cfg_append_printable_line(log,"Key \'%s\' has value:",arg);
          pcStack_c8 = (pcVar2->val).value;
          while( true ) {
            bVar5 = false;
            if (pcStack_c8 != (char *)0x0) {
              bVar5 = pcStack_c8 < (pcVar2->val).value + (pcVar2->val).length;
            }
            if (!bVar5) break;
            cfg_append_printable_line(log,"%s",pcStack_c8);
            sVar3 = strlen(pcStack_c8);
            pcStack_c8 = pcStack_c8 + sVar3 + 1;
          }
          __tempptr._4_4_ = 0;
        }
      }
    }
    else {
      cfg_append_printable_line(log,"Value is not allowed for view command: %s",arg);
    }
  }
LAB_00173740:
  free(arg_00);
  return __tempptr._4_4_;
}

Assistant:

int
cfg_cmd_handle_get(
  struct cfg_instance *instance __attribute__((unused)), struct cfg_db *db, const char *arg, struct autobuf *log) {
  struct cfg_section_type *type, *type_it;
  struct cfg_named_section *named, *named_it;
  struct cfg_entry *entry, *entry_it;
  struct _parsed_argument pa;
  char *arg_copy, *tmp;
  int result;

  if (arg == NULL || *arg == 0) {
    cfg_append_printable_line(log, "Section types in database:");

    CFG_FOR_ALL_SECTION_TYPES(db, type, type_it) {
      cfg_append_printable_line(log, "%s", type->type);
    }
    return 0;
  }

  arg_copy = strdup(arg);
  if (!arg_copy) {
    return -1;
  }

  /* prepare for cleanup */
  result = -1;

  if (_do_parse_arg(arg_copy, &pa, log)) {
    goto handle_get_cleanup;
  }

  if (pa.entry_value != NULL) {
    cfg_append_printable_line(log, "Value is not allowed for view command: %s", arg);
    goto handle_get_cleanup;
  }

  if (pa.entry_key != NULL) {
    if (NULL == (entry = cfg_db_find_entry(db, pa.section_type, pa.section_name, pa.entry_key))) {
      cfg_append_printable_line(log, "Cannot find data for entry: '%s'\n", arg);
      goto handle_get_cleanup;
    }

    cfg_append_printable_line(log, "Key '%s' has value:", arg);
    strarray_for_each_element(&entry->val, tmp) {
      cfg_append_printable_line(log, "%s", tmp);
    }
    result = 0;
    goto handle_get_cleanup;
  }

  if (pa.section_name == NULL) {
    type = cfg_db_find_sectiontype(db, pa.section_type);
    if (type == NULL || type->names.count == 0) {
      cfg_append_printable_line(log, "Cannot find data for section type: %s", arg);
      goto handle_get_cleanup;
    }

    named = avl_first_element(&type->names, named, node);
    if (cfg_db_is_named_section(named)) {
      cfg_append_printable_line(log, "Named sections in section type: %s", pa.section_type);
      CFG_FOR_ALL_SECTION_NAMES(type, named, named_it) {
        cfg_append_printable_line(log, "%s", named->name);
      }
      result = 0;
      goto handle_get_cleanup;
    }
  }

  named = cfg_db_find_namedsection(db, pa.section_type, pa.section_name);
  if (named == NULL) {
    cfg_append_printable_line(log, "Cannot find data for section: %s", arg);
    goto handle_get_cleanup;
  }

  cfg_append_printable_line(log, "Entry keys for section '%s':", arg);
  CFG_FOR_ALL_ENTRIES(named, entry, entry_it) {
    cfg_append_printable_line(log, "%s", entry->name);
  }
  result = 0;

handle_get_cleanup:
  free(arg_copy);
  return result;
}